

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAbsFlops(Gia_Man_t *p,Vec_Int_t *vFlopClasses)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_38;
  int local_34;
  int nFlops;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vFlopClasses_local;
  Gia_Man_t *p_local;
  
  local_38 = 0;
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(5000);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      _nFlops = Gia_ManCi(p,local_34);
      bVar6 = _nFlops != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _nFlops->Value = uVar2;
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _nFlops = Gia_ManCi(p,iVar1 + local_34);
      bVar6 = _nFlops != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Vec_IntEntry(vFlopClasses,local_34);
    if (iVar1 == 0) {
      uVar2 = Gia_ManAppendCi(p_00);
      _nFlops->Value = uVar2;
    }
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      _nFlops = Gia_ManCi(p,iVar1 + local_34);
      bVar6 = _nFlops != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Vec_IntEntry(vFlopClasses,local_34);
    if (iVar1 != 0) {
      uVar2 = Gia_ManAppendCi(p_00);
      _nFlops->Value = uVar2;
    }
    local_34 = local_34 + 1;
  }
  Gia_ManHashAlloc(p_00);
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      _nFlops = Gia_ManCo(p,local_34);
      bVar6 = _nFlops != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ObjFanin0(_nFlops);
    Gia_ManDupAbsFlops_rec(p_00,pGVar4);
    iVar1 = Gia_ObjFanin0Copy(_nFlops);
    Gia_ManAppendCo(p_00,iVar1);
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar6 = false;
    if (local_34 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _nFlops = Gia_ManCo(p,iVar1 + local_34);
      bVar6 = _nFlops != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar1 = Vec_IntEntry(vFlopClasses,local_34);
    if (iVar1 != 0) {
      pGVar4 = Gia_ObjFanin0(_nFlops);
      Gia_ManDupAbsFlops_rec(p_00,pGVar4);
      iVar1 = Gia_ObjFanin0Copy(_nFlops);
      Gia_ManAppendCo(p_00,iVar1);
      local_38 = local_38 + 1;
    }
    local_34 = local_34 + 1;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,local_38);
  pGVar5 = Gia_ManSeqCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsFlops( Gia_Man_t * p, Vec_Int_t * vFlopClasses )
{ 
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nFlops = 0;
    Gia_ManFillValue( p );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create POs
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPo( p, pObj, i )
    {
        Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    // create RIs
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
        {
            Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nFlops++;
        }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, nFlops );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}